

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_transaction_AddTapScriptSign_Test::TestBody
          (cfdcapi_elements_transaction_AddTapScriptSign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  void **create_handle;
  char *tx_string;
  char *schnorr_signature;
  AssertHelper local_78;
  int ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  void *tx_handle;
  void *handle;
  AssertHelper local_28;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x93d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_handle);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x93e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_signature,(Message *)&tx_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                      local_48._M_allocated_capacity + 1);
    }
    if (tx_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_handle != (void *)0x0)) {
        (**(code **)(*tx_handle + 8))();
      }
      tx_handle = (void *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  create_handle = &tx_handle;
  tx_handle = (void *)0x0;
  pcVar2 = "";
  ret = CfdInitializeTransaction(handle,0xb,2,0,"",create_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x942,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_signature,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = tx_handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (tx_handle == (void *)0x0) {
    testing::Message::Message((Message *)&schnorr_signature);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == tx_handle)",
               "true","false",(char *)create_handle);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_string,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x943,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tx_string,(Message *)&schnorr_signature);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                      local_48._M_allocated_capacity + 1);
    }
    if (schnorr_signature != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (schnorr_signature != (char *)0x0)) {
        (**(code **)(*(long *)schnorr_signature + 8))();
      }
      schnorr_signature = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (ret == 0) {
    ret = CfdSetConfidentialTxGenesisBlockHashByHandle
                    (handle,tx_handle,
                     "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x947,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&schnorr_signature,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    ret = CfdAddConfidentialTxOutput
                    (handle,tx_handle,0x9502f130,"ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0","",
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x94e,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&schnorr_signature,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    ret = CfdAddConfidentialTxOutput
                    (handle,tx_handle,1000,"","",
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x951,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&schnorr_signature,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    ret = CfdSetConfidentialTxUtxoDataByHandle
                    (handle,tx_handle,
                     "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64",0,0x9502f518
                     ,"","","ert1psax8230c8xn4vh248t3f6846j08nhm38dp04wrrdukc94ht90c4skyhl4r",
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","","","",
                     "4cc7411e73828840df9d2ec76b938af654c9c32e5e2ef4a97531ced1e2a20fc7fcc89a821ea823f38e4d592fddbd929374d116d1c49596bc6dc02b365d455c98223cb00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
                     ,true);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x957,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&schnorr_signature,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    pcVar2 = "";
    ret = CfdCreateSighashByHandle
                    (handle,tx_handle,
                     "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64",0,1,false,""
                     ,"","56bf7b05d6a4a76be602450e00086dc79db2a46e17df6bbe2a9ac3d127213624",
                     0xffffffff,"",(char **)&gtest_ar_);
    schnorr_signature = (char *)((ulong)schnorr_signature & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&schnorr_signature,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&schnorr_signature);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tx_string,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x95f,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&tx_string,(Message *)&schnorr_signature);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
      if (schnorr_signature != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (schnorr_signature != (char *)0x0)) {
          (**(code **)(*(long *)schnorr_signature + 8))();
        }
        schnorr_signature = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_sighash","sighash",
               "c3f788643ce43074dee15890bccb6e77bbb5481ab9b3443b7041699a0758de02",
               (char *)gtest_ar_._0_8_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&schnorr_signature);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tx_string,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x960,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&tx_string,(Message *)&schnorr_signature);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
      if (schnorr_signature != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (schnorr_signature != (char *)0x0)) {
          (**(code **)(*(long *)schnorr_signature + 8))();
        }
        schnorr_signature = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
    schnorr_signature = (char *)0x0;
    ret = CfdFinalizeTransaction(handle,tx_handle,&schnorr_signature);
    tx_string = (char *)((ulong)tx_string._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_string);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x965,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (tx_string != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_string != (char *)0x0)) {
          (**(code **)(*(long *)tx_string + 8))();
        }
        tx_string = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"020000000001648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000\""
                 ,"tx_string1",
                 "020000000001648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000"
                 ,schnorr_signature);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx_string);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x967,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (tx_string != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx_string != (char *)0x0)) {
            (**(code **)(*(long *)tx_string + 8))();
          }
          tx_string = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(schnorr_signature);
    }
    schnorr_signature = (char *)0x0;
    if (ret == 0) {
      pcVar2 = "";
      ret = CfdSignSchnorr(handle,"c3f788643ce43074dee15890bccb6e77bbb5481ab9b3443b7041699a0758de02"
                           ,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27","",
                           &schnorr_signature);
      tx_string = (char *)((ulong)tx_string & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx_string);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x96f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (tx_string != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx_string != (char *)0x0)) {
            (**(code **)(*(long *)tx_string + 8))();
          }
          tx_string = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0\""
                 ,"schnorr_signature",
                 "e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0"
                 ,schnorr_signature);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx_string);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x970,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (tx_string != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx_string != (char *)0x0)) {
            (**(code **)(*(long *)tx_string + 8))();
          }
          tx_string = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ret = CfdVerifySchnorr(handle,schnorr_signature,
                             "c3f788643ce43074dee15890bccb6e77bbb5481ab9b3443b7041699a0758de02",
                             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
      tx_string = (char *)((ulong)tx_string & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx_string);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x973,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (tx_string != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx_string != (char *)0x0)) {
            (**(code **)(*(long *)tx_string + 8))();
          }
          tx_string = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(schnorr_signature);
    }
    ret = CfdAddTxSignByHandle
                    (handle,tx_handle,
                     "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64",0,7,
                     "e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa001"
                     ,false,1,false,true);
    tx_string = (char *)((ulong)tx_string & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_string);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x97e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (tx_string != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_string != (char *)0x0)) {
          (**(code **)(*(long *)tx_string + 8))();
        }
        tx_string = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    ret = CfdAddTaprootSignByHandle
                    (handle,tx_handle,
                     "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64",0,"",
                     "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
                     "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
                     ,"");
    tx_string = (char *)((ulong)tx_string & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_string);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x983,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (tx_string != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_string != (char *)0x0)) {
          (**(code **)(*(long *)tx_string + 8))();
        }
        tx_string = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    tx_string = (char *)0x0;
    ret = CfdFinalizeTransaction(handle,tx_handle,&tx_string);
    local_78.data_ = (AssertHelperData *)((ulong)local_78.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x987,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
        local_78.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"020000000101648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000341e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d540000000000\""
                 ,"tx_string",
                 "020000000101648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000341e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d540000000000"
                 ,tx_string);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_78);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x989,pcVar2);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_78.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
          local_78.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(tx_string);
    }
    ret = CfdFreeTransactionHandle(handle,tx_handle);
    local_78.data_ = local_78.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x98e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
        local_78.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x992,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_signature,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_signature);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddTapScriptSign) {
  const char* privkey =
    "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  // const char* pubkey = "031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb";
  // bool is_parity = true;
  const char* schnorr_pubkey = "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb";

  const char* redeem_script =
    "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac";
  // const char* const nodes[] = {
  //   "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
  //   "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
  // };

  // see: TapscriptTreeElements
  // const char* witness_program = "874c7545f839a7565d553ae29d1eba93cf3bee27685f570c6de5b05add657e2b";
  // const char* locking_script = "5120" "874c7545f839a7565d553ae29d1eba93cf3bee27685f570c6de5b05add657e2b";
  const char* address = "ert1psax8230c8xn4vh248t3f6846j08nhm38dp04wrrdukc94ht90c4skyhl4r";
  const char* tap_leaf_hash = "56bf7b05d6a4a76be602450e00086dc79db2a46e17df6bbe2a9ac3d127213624";
  const char* control_block = "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";

  int net_type = kCfdNetworkElementsRegtest;
  int sighash_type = kCfdSigHashAll;
  const char* asset = "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";
  const char* genesis_block_hash = "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f";
  const char* out_point_txid = "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64";
  uint32_t out_point_vout = 0;

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tx_handle = nullptr;
  ret = CfdInitializeTransaction(handle, net_type, 2, 0, "", &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == tx_handle));
  if (ret == kCfdSuccess) {
    ret = CfdSetConfidentialTxGenesisBlockHashByHandle(
      handle, tx_handle, genesis_block_hash);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t amount = 2499999000;
    int64_t amount2 = 2499998000;
    int64_t fee_amount = amount - amount2;
    ret = CfdAddConfidentialTxOutput(handle, tx_handle, amount2,
      "ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0", "", asset, "");
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddConfidentialTxOutput(handle, tx_handle, fee_amount,
      "", "", asset, "");
    EXPECT_EQ(kCfdSuccess, ret);

    const char* scriptsig_template = "4cc7" "411e73828840df9d2ec76b938af654c9c32e5e2ef4a97531ced1e2a20fc7fcc89a821ea823f38e4d592fddbd929374d116d1c49596bc6dc02b365d455c98223cb00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";
    ret = CfdSetConfidentialTxUtxoDataByHandle(handle, tx_handle,
      out_point_txid, out_point_vout, amount, "", "",
      address, asset, "", "", "", scriptsig_template, true);
    EXPECT_EQ(kCfdSuccess, ret);

    char* sighash = NULL;
    const char* exp_sighash = "c3f788643ce43074dee15890bccb6e77bbb5481ab9b3443b7041699a0758de02";
    ret = CfdCreateSighashByHandle(handle, tx_handle,
      out_point_txid, out_point_vout, sighash_type, false, "",
      "", tap_leaf_hash, kCfdCodeSeparatorPositionDefault,
      "", &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ(exp_sighash, sighash);
    CfdFreeStringBuffer(sighash);
    {
      char* tx_string1 = NULL;
      ret = CfdFinalizeTransaction(handle, tx_handle, &tx_string1);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("020000000001648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000", tx_string1);
        CfdFreeStringBuffer(tx_string1);
      }
    }

    char* schnorr_signature = NULL;
    if (ret == kCfdSuccess) {
      ret = CfdSignSchnorr(handle, exp_sighash, privkey, "", &schnorr_signature);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0", schnorr_signature);

      ret = CfdVerifySchnorr(handle, schnorr_signature, exp_sighash, schnorr_pubkey);
      EXPECT_EQ(kCfdSuccess, ret);

      CfdFreeStringBuffer(schnorr_signature);
    }

    // add witness stack
    ret = CfdAddTxSignByHandle(handle, tx_handle,
      out_point_txid, out_point_vout,
      kCfdTaproot,
      "e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0" "01",
      false, sighash_type, false, true);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTaprootSignByHandle(handle, tx_handle,
      out_point_txid, out_point_vout,
      "", redeem_script, control_block, "");
    EXPECT_EQ(kCfdSuccess, ret);

    char* tx_string = NULL;
    ret = CfdFinalizeTransaction(handle, tx_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("020000000101648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000341e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d540000000000", tx_string);
      CfdFreeStringBuffer(tx_string);
    }

    ret = CfdFreeTransactionHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}